

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::ClientHook> __thiscall capnp::QueuedClient::addRef(QueuedClient *this)

{
  ClientHook *extraout_RDX;
  QueuedClient *in_RSI;
  Own<capnp::ClientHook> OVar1;
  Own<capnp::QueuedClient> local_28;
  QueuedClient *this_local;
  
  this_local = this;
  kj::addRef<capnp::QueuedClient>((kj *)&local_28,in_RSI);
  kj::Own<capnp::ClientHook>::Own<capnp::QueuedClient,void>
            ((Own<capnp::ClientHook> *)this,&local_28);
  kj::Own<capnp::QueuedClient>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> addRef() override {
    return kj::addRef(*this);
  }